

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

bool __thiscall google::protobuf::io::Printer::Next(Printer *this)

{
  bool bVar1;
  int iVar2;
  void *void_buffer;
  char *local_20;
  
  do {
    iVar2 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                      (this->output_,&local_20,&this->buffer_size_);
    bVar1 = SUB41(iVar2,0);
    if (bVar1 == false) {
      this->failed_ = true;
    }
    else {
      this->buffer_ = local_20;
    }
  } while ((bVar1 & this->buffer_size_ == 0) != 0);
  return bVar1;
}

Assistant:

bool Printer::Next() {
  do {
    void* void_buffer;
    if (!output_->Next(&void_buffer, &buffer_size_)) {
      failed_ = true;
      return false;
    }
    buffer_ = reinterpret_cast<char*>(void_buffer);
  } while (buffer_size_ == 0);
  return true;
}